

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O0

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getuntil
          (kstream<gzFile_s_*,_FunctorZlib> *this,Delimiter delimiter,string *str,int *dret)

{
  int iVar1;
  ulong uVar2;
  gzFile in_RCX;
  FunctorZlib *in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_4;
  
  if (in_RCX != (gzFile)0x0) {
    *(undefined4 *)in_RCX = 0;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::clear();
  }
  if ((*(int *)(in_RDI + 0x10) < *(int *)(in_RDI + 0x14)) || (*(int *)(in_RDI + 0x18) == 0)) {
    do {
      if (*(int *)(in_RDI + 0x14) <= *(int *)(in_RDI + 0x10)) {
        if (*(int *)(in_RDI + 0x18) != 0) goto LAB_0016bd6a;
        *(undefined4 *)(in_RDI + 0x10) = 0;
        iVar1 = FunctorZlib::operator()
                          (in_RDX,in_RCX,
                           (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (uint)((ulong)in_RDI >> 0x20));
        *(int *)(in_RDI + 0x14) = iVar1;
        if (*(uint *)(in_RDI + 0x14) < *(uint *)(in_RDI + 0x2c)) {
          *(undefined4 *)(in_RDI + 0x18) = 1;
        }
        if (*(int *)(in_RDI + 0x14) == 0) goto LAB_0016bd6a;
      }
      if (in_ESI == 0) {
        for (in_stack_ffffffffffffffd4 = *(int *)(in_RDI + 0x10);
            (in_stack_ffffffffffffffd4 < *(int *)(in_RDI + 0x14) &&
            (*(char *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffd4) != '\n'));
            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
        }
      }
      else if (in_ESI == 1) {
        in_stack_ffffffffffffffd4 = *(int *)(in_RDI + 0x10);
        while ((in_stack_ffffffffffffffd4 < *(int *)(in_RDI + 0x14) &&
               (iVar1 = isspace((int)*(char *)(*(long *)(in_RDI + 8) +
                                              (long)in_stack_ffffffffffffffd4)), iVar1 == 0))) {
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
        }
      }
      else {
        in_stack_ffffffffffffffd4 = 0;
      }
      std::__cxx11::string::append
                ((char *)in_RDX,*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x10));
      *(int *)(in_RDI + 0x10) = in_stack_ffffffffffffffd4 + 1;
    } while (*(int *)(in_RDI + 0x14) <= in_stack_ffffffffffffffd4);
    if (in_RCX != (gzFile)0x0) {
      *(int *)in_RCX = (int)*(char *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffd4);
    }
LAB_0016bd6a:
    local_4 = std::__cxx11::string::length();
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int getuntil(Delimiter delimiter, std::string &str, int *dret)
    {
        if (dret)
            *dret = 0;
        if (!str.empty()) {
            str.clear();
        }

        if (this->begin >= this->end && this->is_eof)
            return -1;
        for (;;)
        {
            int i;
            if (this->begin >= this->end)
            {
                if (!this->is_eof)
                {
                    this->begin = 0;
                    this->end = this->readfunc(this->f, this->buf, bufferSize);
                    if (this->end < bufferSize)
                        this->is_eof = 1;
                    if (this->end == 0)
                        break;
                }
                else
                    break;
            }
            if (delimiter == EOL)
            {
                for (i = this->begin; i < this->end; ++i)
                {
                    if (this->buf[i] == '\n')
                        break;
                }
            }
            else if (delimiter == SPACE)
            {
                for (i = this->begin; i < this->end; ++i)
                {
                    if (isspace(this->buf[i]))
                        break;
                }
            }
            else i = 0;

            str.append(this->buf + this->begin, static_cast<unsigned long>(i - this->begin));
            this->begin = i + 1;
            if (i < this->end)
            {
                if (dret)
                    *dret = this->buf[i];
                break;
            }
        }
        return (int)str.length();
    }